

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.h
# Opt level: O0

size_type __thiscall
despot::util::tinyxml::TiXmlString::find(TiXmlString *this,char tofind,size_type offset)

{
  size_type sVar1;
  char *pcVar2;
  char *local_30;
  char *p;
  size_type offset_local;
  char tofind_local;
  TiXmlString *this_local;
  
  sVar1 = length(this);
  if (offset < sVar1) {
    local_30 = c_str(this);
    for (local_30 = local_30 + offset; *local_30 != '\0'; local_30 = local_30 + 1) {
      if (*local_30 == tofind) {
        pcVar2 = c_str(this);
        return (size_type)(local_30 + -(long)pcVar2);
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_type find(char tofind, size_type offset) const {
		if (offset >= length())
			return npos;

		for (const char* p = c_str() + offset; *p != '\0'; ++p) {
			if (*p == tofind)
				return static_cast<size_type>(p - c_str());
		}
		return npos;
	}